

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O1

void __thiscall wasm::MemoryPacking::optimizeSegmentOps::Optimizer::~Optimizer(Optimizer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  pointer pcVar3;
  
  pTVar2 = (this->super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>).
           super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
           super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>
                                          ).
                                          super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>
                                          .super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                                          stack.flexible.
                                          super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar2);
  }
  (this->super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>).super_Pass
  ._vptr_Pass = (_func_int **)&PTR__Pass_00d87048;
  pcVar3 = (this->super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>).
           super_Pass.name._M_dataplus._M_p;
  paVar1 = &(this->super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>).
            super_Pass.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x110);
  return;
}

Assistant:

void MemoryPacking::optimizeSegmentOps(Module* module) {
  struct Optimizer : WalkerPass<PostWalker<Optimizer>> {
    bool isFunctionParallel() override { return true; }

    // This operates on linear memory, and does not affect reference locals.
    bool requiresNonNullableLocalFixups() override { return false; }

    std::unique_ptr<Pass> create() override {
      return std::make_unique<Optimizer>();
    }

    bool needsRefinalizing;

    void visitMemoryInit(MemoryInit* curr) {
      Builder builder(*getModule());
      auto* segment = getModule()->getDataSegment(curr->segment);
      size_t maxRuntimeSize = segment->isPassive ? segment->data.size() : 0;
      bool mustNop = false;
      bool mustTrap = false;
      auto* offset = curr->offset->dynCast<Const>();
      auto* size = curr->size->dynCast<Const>();
      if (offset && uint32_t(offset->value.geti32()) > maxRuntimeSize) {
        mustTrap = true;
      }
      if (size && uint32_t(size->value.geti32()) > maxRuntimeSize) {
        mustTrap = true;
      }
      if (offset && size) {
        uint64_t offsetVal(offset->value.geti32());
        uint64_t sizeVal(size->value.geti32());
        if (offsetVal + sizeVal > maxRuntimeSize) {
          mustTrap = true;
        } else if (offsetVal == 0 && sizeVal == 0) {
          mustNop = true;
        }
      }
      assert(!mustNop || !mustTrap);
      if (mustNop) {
        // Offset and size are 0, so just trap if dest > memory.size
        replaceCurrent(
          builder.makeIf(makeGtShiftedMemorySize(builder, *getModule(), curr),
                         builder.makeUnreachable()));
      } else if (mustTrap) {
        // Drop dest, offset, and size then trap
        replaceCurrent(builder.blockify(builder.makeDrop(curr->dest),
                                        builder.makeDrop(curr->offset),
                                        builder.makeDrop(curr->size),
                                        builder.makeUnreachable()));
        needsRefinalizing = true;
      } else if (!segment->isPassive) {
        // trap if (dest > memory.size | offset | size) != 0
        replaceCurrent(builder.makeIf(
          builder.makeBinary(
            OrInt32,
            makeGtShiftedMemorySize(builder, *getModule(), curr),
            builder.makeBinary(OrInt32, curr->offset, curr->size)),
          builder.makeUnreachable()));
      }
    }
    void visitDataDrop(DataDrop* curr) {
      if (!getModule()->getDataSegment(curr->segment)->isPassive) {
        ExpressionManipulator::nop(curr);
      }
    }
    void doWalkFunction(Function* func) {
      needsRefinalizing = false;
      super::doWalkFunction(func);
      if (needsRefinalizing) {
        ReFinalize().walkFunctionInModule(func, getModule());
      }
    }
  } optimizer;
  optimizer.run(getPassRunner(), module);
}